

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O3

void __thiscall soul::heart::Parser::parseFunctionDecls(Parser *this,ScannedTopLevelItem *item)

{
  char *pcVar1;
  size_t sVar2;
  pointer pUVar3;
  Module *pMVar4;
  pointer pUVar5;
  ulong uVar6;
  
  pMVar4 = item->module;
  (this->module).object = pMVar4;
  pcVar1 = (item->moduleStartPos).data;
  if ((this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      ).input.data != pcVar1) {
    (this->
    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
    ).input.data = pcVar1;
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip(&this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        );
    pMVar4 = (this->module).object;
  }
  if (pMVar4 != (Module *)0x0) {
    sVar2 = (pMVar4->functions).functions.numActive;
    pUVar5 = (item->functionParamCode).
             super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
             super__Vector_impl_data._M_start;
    pUVar3 = (item->functionParamCode).
             super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (sVar2 != (long)pUVar3 - (long)pUVar5 >> 3) {
      throwInternalCompilerError
                ("module->functions.size() == item.functionParamCode.size()","parseFunctionDecls",
                 0xe7);
    }
    if (sVar2 != (long)(item->functionBodyCode).
                       super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(item->functionBodyCode).
                       super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3) {
      throwInternalCompilerError
                ("module->functions.size() == item.functionBodyCode.size()","parseFunctionDecls",
                 0xe8);
    }
    if (pUVar3 != pUVar5) {
      uVar6 = 0;
      do {
        if ((this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ).input.data != pUVar5[uVar6].data) {
          (this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ).input.data = pUVar5[uVar6].data;
          Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::skip(&this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                );
        }
        pMVar4 = (this->module).object;
        if (pMVar4 == (Module *)0x0) goto LAB_00244154;
        if ((pMVar4->functions).functions.numActive <= uVar6) {
          throwInternalCompilerError("index < numActive","operator[]",0x9f);
        }
        parseFunctionParams(this,(pMVar4->functions).functions.items[uVar6].object);
        uVar6 = uVar6 + 1;
        pUVar5 = (item->functionParamCode).
                 super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
                 super__Vector_impl_data._M_start;
      } while (uVar6 < (ulong)((long)(item->functionParamCode).
                                     super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar5 >> 3)
              );
    }
    (this->module).object = (Module *)0x0;
    return;
  }
LAB_00244154:
  throwInternalCompilerError("object != nullptr","operator->",0x3c);
}

Assistant:

void parseFunctionDecls (ScannedTopLevelItem& item)
    {
        prepareToRescan (item);
        SOUL_ASSERT (module->functions.size() == item.functionParamCode.size());
        SOUL_ASSERT (module->functions.size() == item.functionBodyCode.size());

        for (size_t i = 0; i < item.functionParamCode.size(); ++i)
        {
            resetPosition (item.functionParamCode[i]);
            parseFunctionParams (module->functions.at (i));
        }

        module.reset();
    }